

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O1

bool __thiscall CInput::CJoystick::Relative(CJoystick *this,float *pX,float *pY)

{
  CConfig *pCVar1;
  bool bVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar3;
  float fVar4;
  
  pCVar1 = this->m_pInput->m_pConfig;
  if (pCVar1->m_JoystickEnable == 0) {
    bVar2 = false;
  }
  else {
    (*(this->super_IJoystick)._vptr_IJoystick[6])(this,(ulong)(uint)pCVar1->m_JoystickX);
    (*(this->super_IJoystick)._vptr_IJoystick[6])
              (this,(ulong)(uint)this->m_pInput->m_pConfig->m_JoystickY);
    fVar3 = extraout_XMM0_Da * extraout_XMM0_Da + extraout_XMM0_Da_00 * extraout_XMM0_Da_00;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = (float)this->m_pInput->m_pConfig->m_JoystickTolerance / 50.0;
    bVar2 = fVar4 < fVar3;
    if (fVar4 < fVar3) {
      fVar4 = (fVar3 - fVar4) / (1.0 - fVar4);
      if (fVar4 <= 0.001) {
        fVar4 = 0.001;
      }
      fVar3 = (fVar4 * 0.1) / fVar3;
      *pX = extraout_XMM0_Da * fVar3;
      *pY = extraout_XMM0_Da_00 * fVar3;
    }
  }
  return bVar2;
}

Assistant:

CInput *Input() { return m_pInput; }